

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_array_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  global_object *pgVar1;
  gc_heap_ptr<mjs::gc_string> *name;
  function_object *this;
  array_object *paVar2;
  anon_class_16_1_570cf4e1_for_f local_3b8;
  gc_heap_ptr<mjs::object> local_3a8;
  anon_class_16_1_570cf4e1_for_f local_398;
  gc_heap_ptr<mjs::object> local_388;
  anon_class_16_1_570cf4e1_for_f local_378;
  gc_heap_ptr<mjs::object> local_368;
  anon_class_16_1_570cf4e1_for_f local_358;
  gc_heap_ptr<mjs::object> local_348;
  anon_class_16_1_570cf4e1_for_f local_338;
  gc_heap_ptr<mjs::object> local_328;
  anon_class_16_1_570cf4e1_for_f local_318;
  gc_heap_ptr<mjs::object> local_308;
  anon_class_16_1_570cf4e1_for_f local_2f8;
  gc_heap_ptr<mjs::object> local_2e8;
  anon_class_16_1_570cf4e1_for_f local_2d8;
  gc_heap_ptr<mjs::object> local_2c8;
  anon_class_16_1_570cf4e1_for_f local_2b8;
  gc_heap_ptr<mjs::object> local_2a8;
  anon_class_16_1_570cf4e1_for_f local_298;
  gc_heap_ptr<mjs::object> local_288;
  anon_class_16_1_570cf4e1_for_f local_278;
  gc_heap_ptr<mjs::object> local_268;
  anon_class_16_1_570cf4e1_for_f local_258;
  gc_heap_ptr<mjs::object> local_248;
  anon_class_16_1_570cf4e1_for_f local_238;
  gc_heap_ptr<mjs::object> local_228;
  anon_class_16_1_570cf4e1_for_f local_218;
  gc_heap_ptr<mjs::object> local_208;
  anon_class_16_1_570cf4e1_for_f local_1f8;
  gc_heap_ptr<mjs::object> local_1e8;
  anon_class_16_1_570cf4e1_for_f local_1d8;
  gc_heap_ptr<mjs::object> local_1c8;
  anon_class_16_1_570cf4e1_for_f local_1b8;
  gc_heap_ptr<mjs::object> local_1a8;
  anon_class_16_1_570cf4e1_for_f local_198;
  gc_heap_ptr<mjs::object> local_188;
  anon_class_16_1_570cf4e1_for_f local_178;
  gc_heap_ptr<mjs::object> local_168;
  anon_class_16_1_570cf4e1_for_f local_158;
  gc_heap_ptr<mjs::object> local_148;
  anon_class_24_2_07b10302_for_f local_138;
  gc_heap_ptr<mjs::object> local_120;
  anon_class_24_2_07b10302_for_f local_110;
  gc_heap_ptr<mjs::object> local_f8;
  anon_class_16_1_570cf4e1_for_f local_e8;
  gc_heap_ptr<mjs::object> local_d8;
  version local_c4;
  undefined1 local_c0 [4];
  version version;
  value local_b0;
  string local_88;
  anon_class_16_1_570cf4e1_for_f local_78;
  undefined1 local_68 [8];
  gc_heap_ptr<mjs::function_object> c;
  gc_heap_ptr<mjs::object> local_48;
  undefined1 local_38 [8];
  gc_heap_ptr<mjs::array_object> prototype;
  string Array_str_;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0x13])
            (&prototype.super_gc_heap_ptr_untyped.pos_,pgVar1,"Array");
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0xb])(&local_48);
  array_object::make((gc_heap_ptr<mjs::global_object> *)local_38,(string *)global,
                     (object_ptr *)&prototype.super_gc_heap_ptr_untyped.pos_,(uint32_t)&local_48);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_48);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_78.global,global);
  name = string::unsafe_raw_get((string *)&prototype.super_gc_heap_ptr_untyped.pos_);
  make_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
            ((mjs *)local_68,global,&local_78,name,1);
  make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0((__0 *)&local_78);
  this = gc_heap_ptr<mjs::function_object>::operator->
                   ((gc_heap_ptr<mjs::function_object> *)local_68);
  function_object::default_construct_function(this);
  paVar2 = gc_heap_ptr<mjs::array_object>::operator->((gc_heap_ptr<mjs::array_object> *)local_38);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar1->super_object)._vptr_object[0x13])(&local_88,pgVar1,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)local_c0,(gc_heap_ptr<mjs::function_object> *)local_68);
  value::value(&local_b0,(object_ptr *)local_c0);
  (*(paVar2->super_native_object).super_object._vptr_object[1])(paVar2,&local_88,&local_b0,2);
  value::~value(&local_b0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_c0);
  string::~string(&local_88);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  local_c4 = global_object::language_version(pgVar1);
  if ((int)local_c4 < 1) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_d8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_e8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
              (global,&local_d8,"toString",&local_e8,0);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_1::~__1((__1 *)&local_e8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_d8);
  }
  else {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_f8,(gc_heap_ptr<mjs::array_object> *)local_38);
    local_110.version = local_c4;
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_110.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__2>
              (global,&local_f8,"toString",&local_110,0);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_2::~__2((__2 *)&local_110);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_f8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_120,(gc_heap_ptr<mjs::array_object> *)local_38);
    local_138.version = local_c4;
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_138.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__3>
              (global,&local_120,"toLocaleString",&local_138,0);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::~__3((__3 *)&local_138);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_120);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_148,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_158.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__4>
              (global,&local_148,"concat",&local_158,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_4::~__4((__4 *)&local_158);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_148);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_168,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_178.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__5>
              (global,&local_168,"pop",&local_178,0);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::~__5((__5 *)&local_178);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_168);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_188,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_198.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__6>
              (global,&local_188,"push",&local_198,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_6::~__6((__6 *)&local_198);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_188);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_1a8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1b8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__7>
              (global,&local_1a8,"shift",&local_1b8,0);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_7::~__7((__7 *)&local_1b8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1a8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_1c8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1d8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__8>
              (global,&local_1c8,"unshift",&local_1d8,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_8::~__8((__8 *)&local_1d8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1c8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_1e8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1f8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__9>
              (global,&local_1e8,"slice",&local_1f8,2);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_9::~__9((__9 *)&local_1f8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1e8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_208,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_218.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__10>
              (global,&local_208,"splice",&local_218,2);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_10::~__10((__10 *)&local_218);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_208);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            (&local_228,(gc_heap_ptr<mjs::array_object> *)local_38);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_238.global,global);
  put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__11>
            (global,&local_228,"join",&local_238,1);
  make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_11::~__11((__11 *)&local_238);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_228);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            (&local_248,(gc_heap_ptr<mjs::array_object> *)local_38);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_258.global,global);
  put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__12>
            (global,&local_248,"reverse",&local_258,0);
  make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_12::~__12((__12 *)&local_258);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_248);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            (&local_268,(gc_heap_ptr<mjs::array_object> *)local_38);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_278.global,global);
  put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__13>
            (global,&local_268,"sort",&local_278,1);
  make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_13::~__13((__13 *)&local_278);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_268);
  if (1 < (int)local_c4) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_288,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_298.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__14>
              (global,&local_288,"indexOf",&local_298,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_14::~__14((__14 *)&local_298);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_288);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_2a8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2b8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__15>
              (global,&local_2a8,"lastIndexOf",&local_2b8,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_15::~__15((__15 *)&local_2b8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_2a8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_2c8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2d8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__16>
              (global,&local_2c8,"every",&local_2d8,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_16::~__16((__16 *)&local_2d8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_2c8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_2e8,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2f8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__17>
              (global,&local_2e8,"some",&local_2f8,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_17::~__17((__17 *)&local_2f8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_2e8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_308,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_318.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__18>
              (global,&local_308,"forEach",&local_318,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)&local_318);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_308);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_328,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_338.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__19>
              (global,&local_328,"map",&local_338,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_19::~__19((__19 *)&local_338);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_328);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_348,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_358.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__20>
              (global,&local_348,"filter",&local_358,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_20::~__20((__20 *)&local_358);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_348);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_368,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_378.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__21>
              (global,&local_368,"reduce",&local_378,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_21::~__21((__21 *)&local_378);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_368);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
              (&local_388,(gc_heap_ptr<mjs::array_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_398.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__22>
              (global,&local_388,"reduceRight",&local_398,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_22::~__22((__22 *)&local_398);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_388);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_3a8,(gc_heap_ptr<mjs::function_object> *)local_68);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_3b8.global,global);
    put_native_function<mjs::make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__23>
              (global,&local_3a8,"isArray",&local_3b8,1);
    make_array_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_23::~__23((__23 *)&local_3b8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_3a8);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_68);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::array_object,void>
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::array_object> *)local_38);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_68);
  gc_heap_ptr<mjs::array_object>::~gc_heap_ptr((gc_heap_ptr<mjs::array_object> *)local_38);
  string::~string((string *)&prototype.super_gc_heap_ptr_untyped.pos_);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_array_object(const gc_heap_ptr<global_object>& global) {
    auto Array_str_ = global->common_string("Array");
    auto prototype = array_object::make(global, Array_str_, global->object_prototype(), 0);

    auto c = make_function(global, [global](const value&, const std::vector<value>& args) {
        return value{make_array(global, args)};
    }, Array_str_.unsafe_raw_get(), 1);
    c->default_construct_function();

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    const auto version = global->language_version();

    if (version < version::es3) {
        put_native_function(global, prototype, "toString", [global = global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return value{array_join(this_.object_value(), L",")};
        }, 0);
    } else {
        put_native_function(global, prototype, "toString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_join(this_.object_value(), L",")};
        }, 0);
        put_native_function(global, prototype, "toLocaleString", [version, global = global](const value& this_, const std::vector<value>&) {
            if (version < version::es5) global->validate_type(this_, global->array_prototype(), "array");
            return value{array_to_locale_string(global, this_.object_value())};
        }, 0);
        put_native_function(global, prototype, "concat", [global](const value& this_, const std::vector<value>& args) {
            return array_concat(global, this_, args);
        }, 1);
        put_native_function(global, prototype, "pop", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_pop(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "push", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_push(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "shift", [global](const value& this_, const std::vector<value>&) {
            global->validate_object(this_);
            return array_shift(global, this_.object_value());
        }, 0);
        put_native_function(global, prototype, "unshift", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_unshift(global, this_.object_value(), args);
        }, 1);
        put_native_function(global, prototype, "slice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_slice(global, this_.object_value(), args);
        }, 2);
        put_native_function(global, prototype, "splice", [global](const value& this_, const std::vector<value>& args) {
            global->validate_object(this_);
            return array_splice(global, this_.object_value(), args);
        }, 2);
    }
    put_native_function(global, prototype, "join", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        auto& h = global.heap();
        return value{array_join(this_.object_value(), !args.empty() ? to_string(h, args.front()).view() : std::wstring_view{L","})};
    }, 1);
    put_native_function(global, prototype, "reverse", [global](const value& this_, const std::vector<value>&) {
        global->validate_object(this_);
        const auto& o = this_.object_value();
        const uint32_t length = to_uint32(o->get(L"length"));
        auto& h = global.heap();
        for (uint32_t k = 0; k != length / 2; ++k) {
            const auto i1 = index_string(k);
            const auto i2 = index_string(length - k - 1);
            auto v1 = o->get(i1);
            auto v2 = o->get(i2);
            o->put(string{h, i1}, v2);
            o->put(string{h, i2}, v1);
        }
        return this_;
    }, 0);
    put_native_function(global, prototype, "sort", [global](const value& this_, const std::vector<value>& args) {
        global->validate_object(this_);
        const auto& o = *this_.object_value();
        auto& h = o.heap(); // Capture heap reference (which continues to be valid even after GC) since `this` can move when calling a user-defined compare function (since this can cause GC)
        const uint32_t length = to_uint32(o.get(L"length"));

        value comparefn = !args.empty() ? args.front() : value::undefined;

        auto sort_compare = [comparefn, &h](const value& x, const value& y) {
            if (x.type() == value_type::undefined && y.type() == value_type::undefined) {
                return 0;
            } else if (x.type() == value_type::undefined) {
                return 1;
            } else if (y.type() == value_type::undefined) {
                return -1;
            }
            if (comparefn.type() != value_type::undefined) {
                const auto r = to_number(call_function(comparefn, value::null, {x,y}));
                if (r < 0) return -1;
                if (r > 0) return 1;
                return 0;
            } else {
                const auto xs = to_string(h, x);
                const auto ys = to_string(h, y);
                if (xs.view() < ys.view()) return -1;
                if (xs.view() > ys.view()) return 1;
                return 0;
            }
        };

        std::vector<value> values(length);
        for (uint32_t i = 0; i < length; ++i) {
            values[i] = o.get(index_string(i));
        }
        std::stable_sort(values.begin(), values.end(), [&](const value& x, const value& y) {
            return sort_compare(x, y) < 0;
        });
        // Note: `this` has possibly become invalid here (!)
        auto& o_after = *this_.object_value(); // Recapture object reference (since it could also have moved)
        for (uint32_t i = 0; i < length; ++i) {
            o_after.put(string{h, index_string(i)}, values[i]);
        }
        return this_;
    }, 1);


    if (version >= version::es5) {
        put_native_function(global, prototype, "indexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "lastIndexOf", [global](const value& this_, const std::vector<value>& args) {
            return value{array_last_index_of(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "every", [global](const value& this_, const std::vector<value>& args) {
            return value{array_every(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "some", [global](const value& this_, const std::vector<value>& args) {
            return value{array_some(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "forEach", [global](const value& this_, const std::vector<value>& args) {
            array_for_each(global, this_, args);
            return value::undefined;
        }, 1);

        put_native_function(global, prototype, "map", [global](const value& this_, const std::vector<value>& args) {
            return value{array_map(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "filter", [global](const value& this_, const std::vector<value>& args) {
            return value{array_filter(global, this_, args)};
        }, 1);

        put_native_function(global, prototype, "reduce", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, false)};
        }, 1);

        put_native_function(global, prototype, "reduceRight", [global](const value& this_, const std::vector<value>& args) {
            return value{array_reduce(global, this_, args, true)};
        }, 1);

        put_native_function(global, c, "isArray", [global](const value&, const std::vector<value>& args) {
            return value{!args.empty() && args.front().type() == value_type::object && is_array(args.front().object_value())};
        }, 1);
    }

    return { c, prototype };
}